

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LessThanTests.cpp
# Opt level: O3

void __thiscall IsNotLessThanTests::~IsNotLessThanTests(IsNotLessThanTests *this)

{
  ut11::TestFixture::~TestFixture(&this->super_TestFixture);
  operator_delete(this);
  return;
}

Assistant:

virtual void Run()
	{
		Then("Is::Not::LessThan(5)(3) is Not::True", []()
		{
			AssertThat(ut11::Is::Not::LessThan(5)(3), ut11::Is::Not::True);
		});

		Then("Is::Not::LessThan(5)(5) is Not::False", []()
		{
			AssertThat(ut11::Is::Not::LessThan(5)(5), ut11::Is::Not::False);
		});

		Then("Is::Not::LessThan(5)(12) is Not::False", []()
		{
			AssertThat(ut11::Is::Not::LessThan(5)(12), ut11::Is::Not::False);
		});

		Then("Is::Not::LessThan is an operand", []()
		{
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::Not::GreaterThan(5)) >::value, ut11::Is::True);
		});

		Then("Is::Not::LessThan has an error message", []() {
			AssertThat(ut11::Is::Not::LessThan(5).GetErrorMessage(4), ut11::Is::Not::EqualTo(""));
		});
	}